

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestNative.cpp
# Opt level: O1

Variant * MemberFunction(Variant *__return_storage_ptr__,ScriptPtr *script,Parameters params)

{
  int iVar1;
  int *piVar2;
  undefined8 *puVar3;
  any local_20;
  
  (*((script->super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_IScript
    [8])(&local_20);
  puVar3 = (undefined8 *)std::__any_caster<TestClass*>(&local_20);
  if (puVar3 != (undefined8 *)0x0) {
    piVar2 = (int *)*puVar3;
    if (local_20._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (*local_20._M_manager)(_Op_destroy,&local_20,(_Arg *)0x0);
      local_20._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
    iVar1 = *piVar2;
    __return_storage_ptr__->m_type = Null;
    Jinx::Variant::SetInteger(__return_storage_ptr__,(long)iVar1);
    return __return_storage_ptr__;
  }
  std::__throw_bad_any_cast();
}

Assistant:

static Variant MemberFunction(ScriptPtr script, Parameters params)
{
	TestClass * testClass = JinxAnyCast<TestClass *>(script->GetUserContext());
	return testClass->GetTestValue();
}